

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O2

void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *p,int iLit,Vec_Int_t **pvSyms)

{
  int iVar1;
  Kit_DsdObj_t KVar2;
  int iVar3;
  Kit_DsdObj_t *pKVar4;
  Kit_DsdObj_t *pKVar5;
  Vec_Int_t *p_00;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar1 = Abc_LitIsCompl(iLit);
  if (iVar1 != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                  ,0x124,"void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *, int, Vec_Int_t **)");
  }
  iVar1 = Abc_Lit2Var(iLit);
  pKVar4 = Kit_DsdNtkObj(p,iVar1);
  if (pKVar4 != (Kit_DsdObj_t *)0x0) {
    for (uVar7 = 0; KVar2 = *pKVar4, uVar7 < (uint)KVar2 >> 0x1a; uVar7 = uVar7 + 1) {
      Amap_CreateCheckAsym_rec(p,*(ushort *)(&pKVar4[1].field_0x0 + uVar7 * 2) & 0xfffffffe,pvSyms);
    }
    uVar6 = (uint)KVar2 >> 6 & 7;
    if (uVar6 - 3 < 2) {
      uVar7 = 1;
      for (uVar9 = 0; uVar8 = uVar7, uVar9 < (uint)KVar2 >> 0x1a; uVar9 = uVar9 + 1) {
        for (; uVar8 < (uint)KVar2 >> 0x1a; uVar8 = uVar8 + 1) {
          iVar1 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar4[1].field_0x0 + uVar9 * 2));
          iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar4[1].field_0x0 + uVar8 * 2));
          if (iVar1 != iVar3) {
            iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pKVar4[1].field_0x0 + uVar9 * 2));
            pKVar5 = Kit_DsdNtkObj(p,iVar1);
            if (pKVar5 == (Kit_DsdObj_t *)0x0) {
              iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pKVar4[1].field_0x0 + uVar8 * 2));
              pKVar5 = Kit_DsdNtkObj(p,iVar1);
              if (pKVar5 == (Kit_DsdObj_t *)0x0) {
                p_00 = *pvSyms;
                if (p_00 == (Vec_Int_t *)0x0) {
                  p_00 = Vec_IntAlloc(0x10);
                  *pvSyms = p_00;
                }
                iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pKVar4[1].field_0x0 + uVar9 * 2));
                uVar6 = Abc_Lit2Var((uint)*(ushort *)(&pKVar4[1].field_0x0 + uVar8 * 2));
                Vec_IntPush(p_00,iVar1 << 8 | uVar6);
              }
            }
          }
          KVar2 = *pKVar4;
        }
        uVar7 = uVar7 + 1;
      }
    }
    else if (uVar6 != 5) {
      __assert_fail("pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                    ,300,"void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *, int, Vec_Int_t **)");
    }
  }
  return;
}

Assistant:

void Amap_CreateCheckAsym_rec( Kit_DsdNtk_t * p, int iLit, Vec_Int_t ** pvSyms )
{
    Kit_DsdObj_t * pObj; 
    int i, k, iFanin;
    assert( !Abc_LitIsCompl(iLit) );
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return;
    Kit_DsdObjForEachFanin( p, pObj, iFanin, i )
        Amap_CreateCheckAsym_rec( p, Abc_LitRegular(iFanin), pvSyms );
    if ( pObj->Type == KIT_DSD_PRIME )
        return;
    assert( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR );
    for ( i = 0; i < (int)pObj->nFans; i++ )
    for ( k = i+1; k < (int)pObj->nFans; k++ )
    {
        if ( Abc_LitIsCompl(pObj->pFans[i]) != Abc_LitIsCompl(pObj->pFans[k]) && 
             Kit_DsdNtkObj(p, Abc_Lit2Var(pObj->pFans[i])) == NULL && 
             Kit_DsdNtkObj(p, Abc_Lit2Var(pObj->pFans[k])) == NULL )
        {
            if ( *pvSyms == NULL )
                *pvSyms = Vec_IntAlloc( 16 );
            Vec_IntPush( *pvSyms, (Abc_Lit2Var(pObj->pFans[i]) << 8) | Abc_Lit2Var(pObj->pFans[k]) );
        }
    }
}